

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O1

mkv_timestamp_t MATROSKA_BlockGetFrameStart(matroska_block *Block,size_t FrameNum)

{
  long lVar1;
  mkv_timestamp_t mVar2;
  size_t sVar3;
  
  if ((FrameNum < (Block->Durations)._Used >> 3) &&
     (mVar2 = MATROSKA_BlockTimestamp(Block), mVar2 != 0x7fffffffffffffff)) {
    if (FrameNum != 0) {
      sVar3 = 0;
      do {
        lVar1 = *(long *)((Block->Durations)._Begin + sVar3 * 8);
        if (lVar1 == 0x7fffffffffffffff) goto LAB_001105df;
        mVar2 = mVar2 + lVar1;
        sVar3 = sVar3 + 1;
      } while (FrameNum != sVar3);
    }
  }
  else {
LAB_001105df:
    mVar2 = 0x7fffffffffffffff;
  }
  return mVar2;
}

Assistant:

mkv_timestamp_t MATROSKA_BlockGetFrameStart(const matroska_block *Block, size_t FrameNum)
{
    if (FrameNum >= ARRAYCOUNT(Block->Durations,mkv_timestamp_t))
        return INVALID_TIMESTAMP_T;
    else
    {
        size_t i;
        mkv_timestamp_t Start = MATROSKA_BlockTimestamp((matroska_block*)Block);
        if (Start!=INVALID_TIMESTAMP_T)
        {
            for (i=0;i<FrameNum;++i)
            {
                if (ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i]==INVALID_TIMESTAMP_T)
                    return INVALID_TIMESTAMP_T;
                Start += ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i];
            }
        }
        return Start;
    }
}